

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_image_text_styled
                  (nk_context *ctx,nk_style_button *style,nk_image img,char *text,int len,
                  nk_flags align)

{
  nk_rect bounds_00;
  nk_image img_00;
  nk_button_behavior behavior;
  undefined4 in_ECX;
  float in_EDX;
  undefined8 unaff_RBX;
  nk_command_buffer *in_RDI;
  undefined4 in_R8D;
  undefined8 unaff_R14;
  nk_style_button *unaff_R15;
  nk_user_font *unaff_retaddr;
  nk_input *in_stack_00000008;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_context *in_stack_ffffffffffffff80;
  nk_flags in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  nk_flags *state_00;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  nk_bool nVar2;
  
  if (((in_RDI == (nk_command_buffer *)0x0) || (*(long *)&in_RDI[0x103].use_clipping == 0)) ||
     (*(long *)(*(long *)&in_RDI[0x103].use_clipping + 0xa8) == 0)) {
    nVar2 = 0;
  }
  else {
    uVar1 = (undefined4)((ulong)*(long *)&in_RDI[0x103].use_clipping >> 0x20);
    state_00 = *(nk_flags **)(*(long *)&in_RDI[0x103].use_clipping + 0xa8);
    behavior = nk_widget((nk_rect *)&stack0x00000008,in_stack_ffffffffffffff80);
    if (behavior == NK_BUTTON_DEFAULT) {
      nVar2 = 0;
    }
    else {
      if ((behavior == 2) || ((state_00[1] & 0x1000) != 0)) {
        in_RDI = (nk_command_buffer *)0x0;
      }
      bounds_00.y = (float)in_R8D;
      bounds_00.x = (float)uVar1;
      bounds_00.w = (float)in_ECX;
      bounds_00.h = in_EDX;
      img_00.handle._4_4_ = in_stack_ffffffffffffffe4;
      img_00.handle.id = in_stack_ffffffffffffffe0;
      img_00.w = (short)unaff_RBX;
      img_00.h = (short)((ulong)unaff_RBX >> 0x10);
      img_00.region[0] = (short)((ulong)unaff_RBX >> 0x20);
      img_00.region[1] = (short)((ulong)unaff_RBX >> 0x30);
      img_00.region[2] = (short)unaff_R14;
      img_00.region[3] = (short)((ulong)unaff_R14 >> 0x10);
      img_00._20_4_ = (int)((ulong)unaff_R14 >> 0x20);
      nVar2 = nk_do_button_text_image
                        (state_00,in_RDI,bounds_00,img_00,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,behavior,unaff_R15,
                         unaff_retaddr,in_stack_00000008);
    }
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_button_image_text_styled(struct nk_context *ctx,
const struct nk_style_button *style, struct nk_image img, const char *text,
int len, nk_flags align)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_text_image(&ctx->last_widget_state, &win->buffer,
bounds, img, text, len, align, ctx->button_behavior,
style, ctx->style.font, in);
}